

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O3

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppaVar1;
  aiVector3D **__s;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  uint32_t posB;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  iterator iVar8;
  pointer paVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pointer pSVar16;
  pointer puVar17;
  _Alloc_hider _Var18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  uint i_1;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined4 extraout_var;
  aiMaterial *this_00;
  SIBChunk SVar25;
  aiMesh *paVar26;
  aiLight *paVar27;
  SIBEdge *pSVar28;
  undefined8 uVar29;
  aiMatrix4x4t<float> *paVar30;
  Logger *this_01;
  ulong *puVar31;
  aiFace *paVar32;
  aiVector3D *paVar33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var34;
  aiMesh **__dest;
  aiLight **ppaVar35;
  aiNode *this_02;
  aiNode **ppaVar36;
  aiNode *paVar37;
  uint *puVar38;
  aiMetadata *paVar39;
  aiString *paVar40;
  aiMetadataEntry *paVar41;
  undefined1 *puVar42;
  aiNode *paVar43;
  runtime_error *prVar44;
  aiLightSourceType aVar45;
  aiFace *paVar46;
  pointer pTVar47;
  ulong uVar48;
  uint32_t uVar49;
  pointer pSVar50;
  uint uVar51;
  size_type __n;
  ulong uVar53;
  long lVar54;
  uint32_t *puVar55;
  uint32_t uVar56;
  ulong uVar57;
  iterator iVar58;
  size_t __n_00;
  pointer puVar59;
  char *pcVar60;
  ulong uVar61;
  int8_t *piVar62;
  long lVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  StreamReaderLE stream;
  float shiny;
  SIB sib;
  aiMaterial *defmtl;
  aiColor3D emis;
  aiVector3D uv;
  aiColor3D ambi;
  aiColor3D spec;
  aiColor3D diff;
  aiString name;
  aiString tex;
  aiString defname;
  ulong local_1068;
  StreamReader<false,_false> local_1050;
  aiVector3t<float> local_1018;
  undefined8 local_1008;
  undefined8 uStack_1000;
  aiVector3t<float> local_ff8;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  aiScene *local_fd0;
  undefined8 local_fc8;
  void *local_fb8;
  iterator iStack_fb0;
  aiMaterial **local_fa8;
  void *pvStack_fa0;
  iterator local_f98;
  aiMesh **ppaStack_f90;
  aiLight **local_f88;
  iterator iStack_f80;
  aiLight **local_f78;
  vector<SIBObject,_std::allocator<SIBObject>_> vStack_f70;
  vector<SIBObject,_std::allocator<SIBObject>_> local_f58;
  undefined8 local_f38;
  undefined8 local_f28;
  aiMaterial *local_f10;
  undefined1 local_f08 [32];
  undefined8 local_ee8;
  aiVector3t<float> local_ed8;
  undefined1 local_ec8 [12];
  float fStack_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  aiMatrix4x4 *local_e80;
  undefined1 local_e78 [12];
  float fStack_e6c;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  undefined8 local_e38;
  undefined8 local_e28;
  undefined8 local_e18;
  undefined1 local_e08 [24];
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float local_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float local_dcc;
  uint local_dc8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_dc0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_da8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d48;
  pointer local_d30;
  pointer local_d28;
  _Rb_tree_node_base local_d10;
  size_t local_cf0;
  undefined8 local_ce8;
  undefined8 local_cd8;
  undefined1 local_cc0 [5];
  undefined1 auStack_cbb [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb0 [63];
  aiMatrix4x4 local_8bc;
  ulong local_878;
  size_t local_870;
  float local_868;
  float local_858;
  float local_848;
  undefined1 local_838 [1028];
  aiString local_434;
  SIBChunk *pSVar52;
  
  local_fd0 = pScene;
  _local_cc0 = (pointer)local_cb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"rb","");
  iVar20 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_local_cc0);
  StreamReader<false,_false>::StreamReader
            (&local_1050,(IOStream *)CONCAT44(extraout_var,iVar20),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_cc0 != local_cb0) {
    operator_delete(_local_cc0,local_cb0[0]._M_allocated_capacity + 1);
  }
  if (((int)local_1050.end - (int)local_1050.current & 0xfffffff0U) == 0) {
    prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cc0,
                   "SIB file is either empty or corrupt: ",pFile);
    std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
    *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar44,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f78 = (aiLight **)0x0;
  vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f88 = (aiLight **)0x0;
  iStack_f80._M_current = (aiLight **)0x0;
  local_f98._M_current = (aiMesh **)0x0;
  ppaStack_f90 = (aiMesh **)0x0;
  local_fa8 = (aiMaterial **)0x0;
  pvStack_fa0 = (void *)0x0;
  local_fb8 = (void *)0x0;
  iStack_fb0._M_current = (aiMaterial **)0x0;
  local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_f10 = this_00;
  _local_cc0 = (pointer)local_cb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"DefaultMaterial","");
  _Var18._M_p = _local_cc0;
  __n_00 = 0x3ff;
  if (((ulong)local_cb8._M_pi & 0xfffffc00) == 0) {
    __n_00 = (ulong)local_cb8._M_pi & 0xffffffff;
  }
  local_434.length = (ai_uint32)__n_00;
  memcpy(local_434.data,_local_cc0,__n_00);
  local_434.data[__n_00] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var18._M_p != local_cb0) {
    operator_delete(_Var18._M_p,local_cb0[0]._M_allocated_capacity + 1);
  }
  aiMaterial::AddProperty(local_f10,&local_434,"?mat.name",0,0);
  if (iStack_fb0._M_current == local_fa8) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_fb8,iStack_fb0,&local_f10);
  }
  else {
    *iStack_fb0._M_current = local_f10;
    iStack_fb0._M_current = iStack_fb0._M_current + 1;
  }
  if (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0) {
    local_e80 = &local_8bc;
    do {
      SVar25 = ReadChunk(&local_1050);
      uVar51 = ((int)local_1050.current - (int)local_1050.buffer) + SVar25.Size;
      pSVar52 = (SIBChunk *)(ulong)uVar51;
      local_f08._28_4_ = StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
      uVar56 = SVar25.Tag;
      if ((int)uVar56 < 0x4c474854) {
        if (uVar56 != 0x47525053) {
          if (uVar56 == 0x48454144) {
            uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
            if (uVar51 - 3 < 0xfffffffe) {
              prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_cc0 = (pointer)local_cb0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_cc0,"SIB: Unsupported file version.","");
              std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
              *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
              __cxa_throw(prVar44,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            if (uVar56 != 0x494e5354) goto LAB_0057ff51;
            _local_cc0 = _local_cc0 & 0xffffff0000000000;
            memset(local_cc0 + 5,0x1b,0x3ff);
            local_8bc.a1 = 1.0;
            local_8bc.a2 = 0.0;
            local_8bc.a3 = 0.0;
            local_8bc.a4 = 0.0;
            local_8bc.b1 = 0.0;
            local_8bc.b2 = 1.0;
            local_8bc.b3 = 0.0;
            local_8bc.b4 = 0.0;
            local_8bc.c1 = 0.0;
            local_8bc.c2 = 0.0;
            local_8bc.c3 = 1.0;
            local_8bc.c4 = 0.0;
            local_8bc.d1 = 0.0;
            local_8bc.d2 = 0.0;
            local_8bc.d3 = 0.0;
            local_8bc.d4 = 1.0;
            if (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) == 0) {
              uVar48 = 0;
            }
            else {
              uVar48 = 0;
              do {
                SVar25 = ReadChunk(&local_1050);
                uVar51 = ((int)local_1050.current - (int)local_1050.buffer) + SVar25.Size;
                pSVar52 = (SIBChunk *)(ulong)uVar51;
                uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
                uVar56 = SVar25.Tag;
                if ((int)uVar56 < 0x50494e46) {
                  if (uVar56 == 0x41584953) {
                    ReadAxis(local_e80,&local_1050);
                  }
                  else if (uVar56 != 0x44494e46) {
                    if (uVar56 == 0x494e5349) {
                      uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                      uVar48 = (ulong)uVar21;
                    }
                    else {
LAB_0057fc09:
                      UnknownChunk((StreamReaderLE *)((ulong)SVar25 & 0xffffffff),pSVar52);
                    }
                  }
                }
                else if (uVar56 != 0x50494e46) {
                  if (uVar56 == 0x534d5458) {
                    fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_1008 = (aiMaterial **)CONCAT44(extraout_XMM0_Db,fVar65);
                    uStack_1000 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_fe8 = (aiVector3D **)CONCAT44(extraout_XMM0_Db_00,fVar65);
                    uStack_fe0 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_fc8 = (char *)CONCAT44(extraout_XMM0_Db_01,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_f28 = (void *)CONCAT44(extraout_XMM0_Db_02,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_ee8 = (int8_t *)CONCAT44(extraout_XMM0_Db_03,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_e18 = CONCAT44(extraout_XMM0_Db_04,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_cd8 = (int8_t *)CONCAT44(extraout_XMM0_Db_05,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_ce8 = (pointer)CONCAT44(extraout_XMM0_Db_06,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_e28 = CONCAT44(extraout_XMM0_Db_07,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_e38 = CONCAT44(extraout_XMM0_Db_08,fVar65);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_f38 = CONCAT44(extraout_XMM0_Db_09,fVar65);
                    local_848 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_858 = StreamReader<false,_false>::Get<float>(&local_1050);
                    local_868 = StreamReader<false,_false>::Get<float>(&local_1050);
                    fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                    fVar69 = local_8bc.a2 * local_858;
                    fVar4 = local_8bc.a1 * (float)local_f28;
                    fVar67 = local_8bc.a1 * (float)local_ce8;
                    fVar68 = local_8bc.a1 * local_848;
                    fVar66 = local_8bc.a3 * (float)local_e18;
                    fVar2 = local_8bc.a3 * local_868;
                    local_8bc.a1 = local_8bc.a4 * (float)local_fc8 +
                                   local_8bc.a3 * (float)local_fe8 +
                                   local_8bc.a1 * fVar64 + local_8bc.a2 * (float)local_1008;
                    local_8bc.a3 = local_8bc.a4 * (float)local_f38 +
                                   local_8bc.a3 * (float)local_e38 +
                                   fVar67 + local_8bc.a2 * (float)local_e28;
                    local_8bc.a2 = local_8bc.a4 * (float)local_cd8 +
                                   fVar66 + fVar4 + local_8bc.a2 * (float)local_ee8;
                    fVar70 = local_8bc.b2 * (float)local_1008;
                    fVar71 = local_8bc.b2 * (float)local_e28;
                    fVar72 = local_8bc.b2 * local_858;
                    fVar66 = local_8bc.b1 * (float)local_ce8;
                    fVar4 = local_8bc.b1 * local_848;
                    fVar67 = local_8bc.b4 * (float)local_f38;
                    local_8bc.b2 = local_8bc.b4 * (float)local_cd8 +
                                   local_8bc.b3 * (float)local_e18 +
                                   local_8bc.b1 * (float)local_f28 + local_8bc.b2 * (float)local_ee8
                    ;
                    local_8bc.b1 = local_8bc.b4 * (float)local_fc8 +
                                   local_8bc.b3 * (float)local_fe8 + local_8bc.b1 * fVar64 + fVar70;
                    local_8bc.a4 = local_8bc.a4 * fVar65 + fVar2 + fVar68 + fVar69;
                    local_8bc.b4 = local_8bc.b4 * fVar65 + local_8bc.b3 * local_868 + fVar4 + fVar72
                    ;
                    local_8bc.b3 = fVar67 + local_8bc.b3 * (float)local_e38 + fVar66 + fVar71;
                    fVar4 = local_8bc.c2 * (float)local_1008;
                    fVar72 = local_8bc.c2 * local_858;
                    fVar68 = local_8bc.c1 * local_848;
                    fVar66 = local_8bc.c3 * (float)local_fe8;
                    fVar2 = local_8bc.c3 * (float)local_e18;
                    fVar71 = local_8bc.c3 * local_868;
                    local_8bc.c3 = local_8bc.c4 * (float)local_f38 +
                                   local_8bc.c3 * (float)local_e38 +
                                   local_8bc.c1 * (float)local_ce8 + local_8bc.c2 * (float)local_e28
                    ;
                    local_8bc.c2 = local_8bc.c4 * (float)local_cd8 +
                                   fVar2 + local_8bc.c1 * (float)local_f28 +
                                           local_8bc.c2 * (float)local_ee8;
                    local_8bc.c1 = local_8bc.c4 * (float)local_fc8 +
                                   fVar66 + local_8bc.c1 * fVar64 + fVar4;
                    local_1068._0_4_ = local_8bc.d2;
                    fVar69 = local_8bc.d1 * (float)local_f28;
                    fVar70 = local_8bc.d1 * (float)local_ce8;
                    fVar66 = local_8bc.d3 * (float)local_e18;
                    fVar2 = local_8bc.d4 * (float)local_fc8;
                    fVar4 = local_8bc.d4 * (float)local_cd8;
                    fVar67 = local_8bc.d4 * (float)local_f38;
                    local_8bc.d4 = local_8bc.d4 * fVar65 +
                                   local_8bc.d3 * local_868 +
                                   local_8bc.d1 * local_848 + (float)local_1068 * local_858;
                    local_8bc.d1 = fVar2 + local_8bc.d3 * (float)local_fe8 +
                                           local_8bc.d1 * fVar64 +
                                           (float)local_1068 * (float)local_1008;
                    local_8bc.c4 = local_8bc.c4 * fVar65 + fVar71 + fVar68 + fVar72;
                    local_8bc.d3 = fVar67 + local_8bc.d3 * (float)local_e38 +
                                            fVar70 + (float)local_1068 * (float)local_e28;
                    local_8bc.d2 = fVar4 + fVar66 + fVar69 + (float)local_1068 * (float)local_ee8;
                  }
                  else {
                    if (uVar56 != 0x534e414d) goto LAB_0057fc09;
                    ReadString((aiString *)local_838,&local_1050,SVar25.Size >> 1);
                    uVar57 = local_838._0_8_ & 0xffffffff;
                    local_cc0._0_4_ = local_838._0_4_;
                    memcpy(local_cc0 + 4,local_838 + 4,uVar57);
                    local_cc0[uVar57 + 4] = 0;
                  }
                }
                StreamReader<false,_false>::SetPtr
                          (&local_1050,
                           (int8_t *)
                           ((ulong)(uint)((int)local_1050.limit - (int)local_1050.buffer) +
                           CONCAT44(local_1050.buffer._4_4_,(int)local_1050.buffer)));
                StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
              } while (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0);
            }
            uVar57 = ((long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
            if (uVar57 < uVar48 || uVar57 - uVar48 == 0) {
              prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_838._0_8_ = local_838 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_838,"SIB: Invalid shape index.","");
              std::runtime_error::runtime_error(prVar44,(string *)local_838);
              *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
              __cxa_throw(prVar44,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            local_878 = vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar48].meshIdx;
            local_870 = vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar48].meshCount;
            std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                      (&local_f58,(value_type *)local_cc0);
          }
        }
      }
      else if ((int)uVar56 < 0x53484150) {
        if (uVar56 == 0x4c474854) {
          paVar27 = (aiLight *)operator_new(0x46c);
          (paVar27->mName).length = 0;
          (paVar27->mName).data[0] = '\0';
          memset((paVar27->mName).data + 1,0x1b,0x3ff);
          paVar27->mType = aiLightSource_UNDEFINED;
          (paVar27->mPosition).x = 0.0;
          (paVar27->mPosition).y = 0.0;
          (paVar27->mPosition).z = 0.0;
          (paVar27->mDirection).x = 0.0;
          (paVar27->mDirection).y = 0.0;
          *(undefined8 *)&(paVar27->mDirection).z = 0;
          (paVar27->mUp).x = 0.0;
          (paVar27->mUp).y = 0.0;
          *(undefined8 *)&(paVar27->mUp).z = 0;
          paVar27->mAttenuationLinear = 1.0;
          paVar27->mAttenuationQuadratic = 0.0;
          (paVar27->mColorDiffuse).r = 0.0;
          (paVar27->mColorDiffuse).g = 0.0;
          (paVar27->mColorDiffuse).b = 0.0;
          (paVar27->mColorSpecular).r = 0.0;
          (paVar27->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar27->mColorSpecular).b = 0;
          (paVar27->mColorAmbient).g = 0.0;
          (paVar27->mColorAmbient).b = 0.0;
          paVar27->mAngleInnerCone = 6.2831855;
          paVar27->mAngleOuterCone = 6.2831855;
          (paVar27->mSize).x = 0.0;
          (paVar27->mSize).y = 0.0;
          local_838._0_8_ = paVar27;
          if (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0) {
            local_fc8 = (paVar27->mName).data;
            do {
              SVar25 = ReadChunk(&local_1050);
              uVar51 = ((int)local_1050.current - (int)local_1050.buffer) + SVar25.Size;
              pSVar52 = (SIBChunk *)(ulong)uVar51;
              uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
              if (SVar25.Tag == 0x534e414d) {
                ReadString((aiString *)local_cc0,&local_1050,SVar25.Size >> 1);
                uVar48 = (ulong)_local_cc0 & 0xffffffff;
                (paVar27->mName).length = local_cc0._0_4_;
                memcpy(local_fc8,local_cc0 + 4,uVar48);
                (paVar27->mName).data[uVar48] = '\0';
              }
              else if (SVar25.Tag == 0x4c4e464f) {
                uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                aVar45 = aiLightSource_UNDEFINED;
                if (uVar21 < 3) {
                  aVar45 = *(aiLightSourceType *)(&DAT_006cd250 + (ulong)uVar21 * 4);
                }
                paVar27->mType = aVar45;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mPosition).x = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mPosition).y = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mPosition).z = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mDirection).x = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mDirection).y = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                (paVar27->mDirection).z = fVar64;
                ReadColor((StreamReaderLE *)local_cc0);
                *(pointer *)&paVar27->mColorDiffuse = _local_cc0;
                (paVar27->mColorDiffuse).b = local_cb8._M_pi._0_4_;
                ReadColor((StreamReaderLE *)local_cc0);
                *(pointer *)&paVar27->mColorAmbient = _local_cc0;
                (paVar27->mColorAmbient).b = local_cb8._M_pi._0_4_;
                ReadColor((StreamReaderLE *)local_cc0);
                *(pointer *)&paVar27->mColorSpecular = _local_cc0;
                (paVar27->mColorSpecular).b = local_cb8._M_pi._0_4_;
                fVar65 = StreamReader<false,_false>::Get<float>(&local_1050);
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                local_1008 = (aiMaterial **)CONCAT44(local_1008._4_4_,fVar64);
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                paVar27->mAttenuationConstant = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                paVar27->mAttenuationLinear = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                paVar27->mAttenuationQuadratic = fVar64;
                fVar64 = 1e-05;
                if (1e-05 <= fVar65) {
                  fVar64 = fVar65;
                }
                local_fe8 = (aiVector3D **)CONCAT44(local_fe8._4_4_,1.0 / fVar64);
                fVar64 = powf(0.99,1.0 / fVar64);
                fVar65 = acosf(fVar64);
                fVar64 = powf(0.01,(float)local_fe8);
                fVar66 = acosf(fVar64);
                fVar64 = (float)local_1008 * 0.017453292;
                if (fVar66 <= (float)local_1008 * 0.017453292) {
                  fVar64 = fVar66;
                }
                fVar66 = fVar64;
                if (fVar65 <= fVar64) {
                  fVar66 = fVar65;
                }
                paVar27->mAngleInnerCone = fVar66;
                paVar27->mAngleOuterCone = fVar64;
              }
              else {
                UnknownChunk((StreamReaderLE *)((ulong)SVar25 & 0xffffffff),pSVar52);
              }
              StreamReader<false,_false>::SetPtr
                        (&local_1050,
                         (int8_t *)
                         ((ulong)(uint)((int)local_1050.limit - (int)local_1050.buffer) +
                         CONCAT44(local_1050.buffer._4_4_,(int)local_1050.buffer)));
              StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
            } while (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0);
          }
          if (iStack_f80._M_current == local_f78) {
            std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                      ((vector<aiLight*,std::allocator<aiLight*>> *)&local_f88,iStack_f80,
                       (aiLight **)local_838);
          }
          else {
            *iStack_f80._M_current = paVar27;
            iStack_f80._M_current = iStack_f80._M_current + 1;
          }
        }
        else if (uVar56 == 0x4d415452) {
          ReadColor((StreamReaderLE *)local_e08);
          ReadColor((StreamReaderLE *)local_ec8);
          ReadColor((StreamReaderLE *)local_e78);
          ReadColor((StreamReaderLE *)local_f08);
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
          local_ff8.x = (float)uVar51;
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
          ReadString((aiString *)local_cc0,&local_1050,uVar51 >> 1);
          uVar51 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
          ReadString((aiString *)local_838,&local_1050,uVar51 >> 1);
          paVar26 = (aiMesh *)operator_new(0x10);
          aiMaterial::aiMaterial((aiMaterial *)paVar26);
          local_1018._0_8_ = paVar26;
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar26,local_e08,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar26,local_ec8,0xc,"$clr.ambient",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar26,local_e78,0xc,"$clr.specular",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar26,local_f08,0xc,"$clr.emissive",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar26,&local_ff8,4,"$mat.shininess",0,0,aiPTI_Float);
          aiMaterial::AddProperty((aiMaterial *)paVar26,(aiString *)local_cc0,"?mat.name",0,0);
          if (local_838._0_4_ != 0) {
            aiMaterial::AddProperty((aiMaterial *)paVar26,(aiString *)local_838,"$tex.file",1,0);
            aiMaterial::AddProperty((aiMaterial *)paVar26,(aiString *)local_838,"$tex.file",3,0);
          }
          if (iStack_fb0._M_current == local_fa8) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_fb8,iStack_fb0,
                       (aiMaterial **)&local_1018);
          }
          else {
            *iStack_fb0._M_current = (aiMaterial *)paVar26;
            iStack_fb0._M_current = iStack_fb0._M_current + 1;
          }
        }
        else {
LAB_0057ff51:
          UnknownChunk((StreamReaderLE *)((ulong)SVar25 & 0xffffffff),pSVar52);
        }
      }
      else if (uVar56 == 0x53484150) {
        local_e08._0_4_ = 1.0;
        local_e08._4_4_ = 0.0;
        local_e08._8_4_ = 0.0;
        local_e08._12_4_ = 0.0;
        local_e08._16_4_ = 0.0;
        local_e08._20_4_ = 1.0;
        uStack_df0 = (int8_t *)0x0;
        uStack_de8 = (int8_t *)0x0;
        local_de0 = 1.0;
        local_ddc = 0.0;
        fStack_dd8 = 0.0;
        fStack_dd4 = 0.0;
        fStack_dd0 = 0.0;
        local_dcc = 1.0;
        local_d10._M_color = _S_red;
        local_d10._M_parent = (_Base_ptr)0x0;
        memset(&local_dc0,0,0xa8);
        local_d10._M_left = &local_d10;
        local_cf0 = 0;
        local_f38 = 0;
        local_838._0_8_ = local_838._0_8_ & 0xffffff0000000000;
        local_d10._M_right = local_d10._M_left;
        memset(local_838 + 5,0x1b,0x3ff);
        while (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0) {
          SVar25 = ReadChunk(&local_1050);
          uVar21 = SVar25.Size;
          uVar51 = ((int)local_1050.current - (int)local_1050.buffer) + uVar21;
          pSVar52 = (SIBChunk *)(ulong)uVar51;
          uVar51 = StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
          uVar56 = SVar25.Tag;
          if ((int)uVar56 < 0x46545653) {
            if ((int)uVar56 < 0x46414353) {
              if ((int)uVar56 < 0x45435253) {
                if (uVar56 == 0x41584953) {
                  ReadAxis((aiMatrix4x4 *)local_e08,&local_1050);
                }
                else if (uVar56 != 0x44494e46) goto LAB_00580964;
              }
              else if (uVar56 == 0x45435253) {
                if ((int)local_1050.limit != (int)local_1050.current) {
                  do {
                    uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    uVar48 = (ulong)uVar21;
                    uVar57 = ((long)local_d28 - (long)local_d30 >> 2) * -0x5555555555555555;
                    if (uVar57 < uVar48 || uVar57 - uVar48 == 0) {
                      prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_cc0 = (pointer)local_cb0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_cc0,"SIB: Invalid edge index.","");
                      std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
                      *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
                      __cxa_throw(prVar44,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_d30[uVar48].creased = true;
                  } while ((int)local_1050.limit != (int)local_1050.current);
                }
              }
              else {
                if (uVar56 != 0x45444753) goto LAB_00580964;
                if ((int)local_1050.limit != (int)local_1050.current) {
                  do {
                    uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    uVar22 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    GetEdge((SIBMesh *)local_e08,uVar21,uVar22);
                  } while ((int)local_1050.limit != (int)local_1050.current);
                }
              }
            }
            else if ((int)uVar56 < 0x46414d41) {
              if (uVar56 == 0x46414353) {
                if ((int)local_1050.limit == (int)local_1050.current) {
                  uVar21 = 0;
                }
                else {
                  uVar21 = 0;
                  do {
                    uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    lVar63 = (long)local_d78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                    lVar54 = lVar63 >> 2;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              (&local_d78,lVar54 + (ulong)(uVar23 * 3) + 1);
                    puVar59 = local_d78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    *(uint *)((long)local_d78.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar63) = uVar23;
                    local_cc0._0_4_ = (float)lVar54;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    emplace_back<unsigned_int>(&local_d60,(uint *)local_cc0);
                    _local_cc0 = (pointer)((ulong)(uint)stack0xfffffffffffff344 << 0x20);
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    emplace_back<unsigned_int>(&local_d48,(uint *)local_cc0);
                    uVar22 = uVar21;
                    if (uVar23 != 0) {
                      puVar38 = puVar59 + lVar54 + 1;
                      uVar22 = uVar23 + uVar21;
                      do {
                        uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                        uVar48 = ((long)local_dc0.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_dc0.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x5555555555555555;
                        if (uVar48 < uVar24 || uVar48 - uVar24 == 0) {
                          prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
                          _local_cc0 = (pointer)local_cb0;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_cc0,"Vertex index is out of range.","");
                          std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
                          *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
                          __cxa_throw(prVar44,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        *puVar38 = uVar24;
                        puVar38[1] = uVar21;
                        puVar38[2] = uVar21;
                        puVar38 = puVar38 + 3;
                        uVar21 = uVar21 + 1;
                        uVar23 = uVar23 - 1;
                      } while (uVar23 != 0);
                    }
                    uVar21 = uVar22;
                  } while ((int)local_1050.limit != (int)local_1050.current);
                }
                _local_cc0 = (pointer)0x0;
                local_cb8._M_pi = local_cb8._M_pi & 0xffffffff00000000;
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                          (&local_da8,(ulong)uVar21,(value_type *)local_cc0);
                _local_cc0 = (pointer)0x0;
                local_cb8._M_pi = local_cb8._M_pi & 0xffffffff00000000;
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                          (&local_d90,(ulong)uVar21,(value_type *)local_cc0);
                local_dc8 = uVar21;
              }
              else if (uVar56 != 0x46414853) goto LAB_00580964;
            }
            else if (uVar56 == 0x46414d41) {
              uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
              uVar23 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
              uVar23 = uVar23 + 1;
              uVar22 = uVar21;
              if ((int)local_1050.limit != (int)local_1050.current) {
                do {
                  uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                  uVar24 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                  if (uVar22 < uVar21) {
                    uVar48 = (ulong)uVar22;
                    do {
                      if ((ulong)((long)local_d48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar48) {
                        prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
                        _local_cc0 = (pointer)local_cb0;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_cc0,"Invalid face index.","");
                        std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
                        *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
                        __cxa_throw(prVar44,&DeadlyImportError::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar48] = uVar23;
                      uVar48 = uVar48 + 1;
                    } while (uVar21 != uVar48);
                  }
                  uVar23 = uVar24 + 1;
                  uVar22 = uVar21;
                } while ((int)local_1050.limit != (int)local_1050.current);
              }
              uVar48 = (ulong)uVar21;
              if (uVar48 < (ulong)((long)local_d48.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d48.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2)) {
                do {
                  uVar21 = uVar21 + 1;
                  local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar48] = uVar23;
                  uVar48 = (ulong)uVar21;
                } while (uVar48 < (ulong)((long)local_d48.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_d48.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2));
              }
            }
            else if (uVar56 != 0x464d4952) goto LAB_00580964;
          }
          else if ((int)uVar56 < 0x534e414d) {
            if ((int)uVar56 < 0x4d495250) {
              if (uVar56 == 0x46545653) {
                if ((int)local_1050.limit != (int)local_1050.current) {
                  do {
                    uVar21 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    uVar22 = StreamReader<false,_false>::Get<unsigned_int>(&local_1050);
                    if ((ulong)((long)local_d60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_d60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <=
                        (ulong)uVar21) {
                      prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_cc0 = (pointer)local_cb0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_cc0,"Invalid face index.","");
                      std::runtime_error::runtime_error(prVar44,(string *)local_cc0);
                      *(undefined ***)prVar44 = &PTR__runtime_error_007dd738;
                      __cxa_throw(prVar44,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    if (uVar22 != 0) {
                      puVar38 = local_d78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                                (ulong)(local_d60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar21] + 1) + 2;
                      do {
                        uVar21 = *puVar38;
                        fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                        local_d90.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar21].x = fVar64;
                        fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                        local_d90.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar21].y = fVar64;
                        puVar38 = puVar38 + 3;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                  } while ((int)local_1050.limit != (int)local_1050.current);
                }
              }
              else if (uVar56 != 0x494d5250) goto LAB_00580964;
            }
            else if ((uVar56 != 0x4d495250) && (uVar56 != 0x50494e46)) {
LAB_00580964:
              UnknownChunk((StreamReaderLE *)((ulong)SVar25 & 0xffffffff),pSVar52);
            }
          }
          else if ((int)uVar56 < 0x564d4952) {
            if (uVar56 == 0x534e414d) {
              ReadString((aiString *)local_cc0,&local_1050,uVar21 >> 1);
              uVar48 = (ulong)_local_cc0 & 0xffffffff;
              memcpy(local_838 + 4,local_cc0 + 4,uVar48);
              local_838[uVar48 + 4] = 0;
              local_f38 = uVar48;
            }
            else if (uVar56 != 0x5458534d) goto LAB_00580964;
          }
          else if (uVar56 != 0x564d4952) {
            if (uVar56 != 0x56525453) goto LAB_00580964;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_dc0,((ulong)SVar25 >> 0x20) / 0xc);
            if (2 < uVar21 >> 2) {
              lVar63 = 0;
              do {
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->x + lVar63) = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->y + lVar63) = fVar64;
                fVar64 = StreamReader<false,_false>::Get<float>(&local_1050);
                *(float *)((long)&(local_dc0.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z + lVar63) = fVar64;
                lVar63 = lVar63 + 0xc;
              } while ((ulong)(uint)((int)(((ulong)SVar25 >> 0x20) / 0xc) << 2) * 3 != lVar63);
            }
          }
          StreamReader<false,_false>::SetPtr
                    (&local_1050,
                     (int8_t *)
                     ((ulong)(uint)((int)local_1050.limit - (int)local_1050.buffer) +
                     CONCAT44(local_1050.buffer._4_4_,(int)local_1050.buffer)));
          StreamReader<false,_false>::SetReadLimit(&local_1050,uVar51);
        }
        local_838._0_4_ = (int)local_f38;
        if ((long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          __assert_fail("smesh.faceStart.size() == smesh.mtls.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                        ,0x238,"void ReadShape(SIB *, StreamReaderLE *)");
        }
        puVar59 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar63 = (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          lVar54 = 0;
          do {
            uVar48 = (ulong)local_d60.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar54];
            uVar51 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar48];
            if (uVar51 != 0) {
              puVar55 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar48 + 1;
              uVar56 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar48 + (ulong)(uVar51 * 3 - 3) + 1];
              do {
                uVar49 = *puVar55;
                pSVar28 = GetEdge((SIBMesh *)local_e08,uVar56,uVar49);
                if (pSVar28->faceA == 0xffffffff) {
LAB_00580acb:
                  pSVar28->faceA = (uint32_t)lVar54;
                }
                else if (pSVar28->faceB == 0xffffffff) {
                  pSVar28 = (SIBEdge *)&pSVar28->faceB;
                  goto LAB_00580acb;
                }
                puVar55 = puVar55 + 3;
                uVar51 = uVar51 - 1;
                uVar56 = uVar49;
              } while (uVar51 != 0);
            }
            lVar54 = lVar54 + 1;
            puVar59 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (lVar54 != lVar63 + (ulong)(lVar63 == 0));
        }
        puVar17 = local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __n = (long)local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar59 >> 2;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_cc0,__n,
                   (allocator_type *)local_ec8);
        if (puVar17 != puVar59) {
          local_e38 = __n + (__n == 0);
          uVar48 = 0;
          do {
            uVar57 = (ulong)local_d60.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar48];
            uVar61 = (ulong)local_d78.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar57];
            if (uVar61 == 0) {
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
            }
            else {
              fVar2 = local_dc0.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar57 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].y;
              fVar4 = local_dc0.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar57 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].z;
              fVar64 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              uVar53 = 0;
              fVar67 = local_dc0.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [uVar57 + (uVar61 * 3 - 3 & 0xffffffff) + 1]].x;
              do {
                fVar68 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [uVar57 + (uVar53 & 0xffffffff) + 1]].x;
                uVar3 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [uVar57 + (uVar53 & 0xffffffff) + 1]].y;
                uVar5 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [uVar57 + (uVar53 & 0xffffffff) + 1]].z;
                fVar64 = fVar64 + ((float)uVar5 * fVar2 - fVar4 * (float)uVar3);
                fVar65 = fVar65 + (fVar68 * fVar4 - fVar67 * (float)uVar5);
                fVar66 = fVar66 + (fVar67 * (float)uVar3 - fVar2 * fVar68);
                uVar53 = uVar53 + 3;
                fVar2 = (float)uVar3;
                fVar4 = (float)uVar5;
                fVar67 = fVar68;
              } while (uVar61 * 3 != uVar53);
            }
            *(ulong *)(_local_cc0 + uVar48 * 0xc) = CONCAT44(fVar65,fVar64);
            *(float *)(_local_cc0 + uVar48 * 0xc + 8) = fVar66;
            uVar48 = uVar48 + 1;
          } while (uVar48 != local_e38);
          uVar48 = 0;
          do {
            local_cd8 = (int8_t *)
                        (ulong)local_d78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_d60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar48]];
            if (local_cd8 != (int8_t *)0x0) {
              local_ce8 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_d60.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar48] + 1;
              piVar62 = (int8_t *)0x0;
              local_e28 = uVar48;
              do {
                uVar56 = local_ce8[(uint)((int)piVar62 * 3)];
                local_e18 = (ulong)local_ce8[(int)piVar62 * 3 + 1];
                uVar29 = CONCAT71((uint7)(uint3)(local_ce8[(int)piVar62 * 3 + 1] >> 8),1);
                uVar48 = local_e28 & 0xffffffff;
                local_ee8 = piVar62;
                do {
                  local_f28 = (void *)CONCAT44(local_f28._4_4_,(int)uVar29);
                  local_1008 = (aiMaterial **)0x0;
                  uStack_1000 = 0;
                  local_fe8 = (aiVector3D **)0x0;
                  uStack_fe0 = 0;
                  local_fc8 = (char *)CONCAT44(local_fc8._4_4_,(int)uVar48);
                  uVar57 = uVar48;
                  local_1068 = uVar48;
                  while( true ) {
                    uVar48 = uVar57;
                    local_fe8 = (aiVector3D **)
                                CONCAT44((float)((ulong)*(undefined8 *)(_local_cc0 + uVar48 * 0xc)
                                                >> 0x20) + local_fe8._4_4_,
                                         (float)*(undefined8 *)(_local_cc0 + uVar48 * 0xc) +
                                         (float)local_fe8);
                    uStack_fe0 = CONCAT44(uStack_fe0._4_4_ + 0.0,(float)uStack_fe0 + 0.0);
                    local_1008 = (aiMaterial **)
                                 CONCAT44(local_1008._4_4_,
                                          (float)local_1008 +
                                          *(float *)(_local_cc0 + uVar48 * 0xc + 8));
                    uVar57 = (ulong)local_d60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar48];
                    uVar51 = local_d78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar57];
                    if (uVar51 == 0) break;
                    puVar55 = local_d78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar57 + 1;
                    uVar61 = 0xffffffff;
                    uVar49 = local_d78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar57 + (ulong)(uVar51 * 3 - 3) + 1]
                    ;
                    do {
                      posB = *puVar55;
                      uVar21 = (uint)uVar48;
                      uVar57 = uVar61;
                      if ((uVar49 == uVar56) || (posB == uVar56)) {
                        pSVar28 = GetEdge((SIBMesh *)local_e08,uVar49,posB);
                        uVar22 = pSVar28->faceA;
                        uVar23 = pSVar28->faceB;
                        if ((((uVar22 == uVar21) || (uVar23 == uVar21)) &&
                            (pSVar28->creased == false)) &&
                           (((uVar22 == uVar21 || ((float)uVar22 == (float)local_1068)) ||
                            (uVar57 = (ulong)uVar22, uVar22 == 0xffffffff)))) {
                          uVar57 = (ulong)uVar23;
                          if (uVar23 == 0xffffffff) {
                            uVar57 = uVar61;
                          }
                          if ((float)uVar23 == (float)local_1068) {
                            uVar57 = uVar61;
                          }
                          if (uVar23 == uVar21) {
                            uVar57 = uVar61;
                          }
                        }
                      }
                      puVar55 = puVar55 + 3;
                      uVar51 = uVar51 - 1;
                      uVar61 = uVar57;
                      uVar49 = posB;
                    } while (uVar51 != 0);
                    if (((int)uVar57 == -1) ||
                       (local_1068 = uVar48, (float)(int)uVar57 == (float)local_fc8)) break;
                  }
                  uVar29 = 0;
                } while (((ulong)local_f28 & 1) != 0);
                fVar2 = SQRT((float)local_1008 * (float)local_1008 +
                             (float)local_fe8 * (float)local_fe8 + local_fe8._4_4_ * local_fe8._4_4_
                            );
                fVar66 = 1.0 / fVar2;
                fVar64 = (float)local_fe8;
                fVar65 = local_fe8._4_4_;
                if (1e-09 < fVar2) {
                  fVar64 = (float)local_fe8 * fVar66;
                  fVar65 = local_fe8._4_4_ * fVar66;
                }
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].x = fVar64;
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].y = fVar65;
                local_da8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e18].z =
                     (float)(~-(uint)(1e-09 < fVar2) & (uint)(float)local_1008 |
                            (uint)(fVar66 * (float)local_1008) & -(uint)(1e-09 < fVar2));
                piVar62 = local_ee8 + 1;
                uVar48 = local_e28;
              } while (piVar62 != local_cd8);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != local_e38);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_cc0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(_local_cc0,local_cb0[0]._M_allocated_capacity - (long)_local_cc0);
        }
        local_ec8._0_8_ = CONCAT44(local_e08._4_4_,local_e08._0_4_);
        unique0x10003588 =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_e08._12_4_,local_e08._8_4_);
        local_eb8 = (int8_t *)CONCAT44(local_e08._20_4_,local_e08._16_4_);
        uStack_ea0 = (int8_t *)CONCAT44(local_ddc,local_de0);
        fStack_e94 = fStack_dd4;
        local_e98 = fStack_dd8;
        fStack_e8c = local_dcc;
        fStack_e90 = fStack_dd0;
        local_ea8 = uStack_de8;
        uStack_eb0 = uStack_df0;
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_ec8);
        local_e58 = local_ea8;
        local_e68 = local_eb8;
        local_e78._0_8_ = local_ec8._0_8_;
        local_e48 = local_e98;
        fStack_e44 = fStack_e94;
        fStack_e40 = fStack_e90;
        fStack_e3c = fStack_e8c;
        uStack_e50 = (int8_t *)((ulong)uStack_ea0 & 0xffffffff);
        uStack_e60 = (int8_t *)((ulong)uStack_eb0 & 0xffffffff);
        stack0xfffffffffffff190 = stack0xfffffffffffff140 & 0xffffffff;
        paVar30 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_e78);
        fVar64 = paVar30->b1;
        paVar30->b1 = paVar30->a2;
        paVar30->a2 = fVar64;
        fVar64 = paVar30->c1;
        paVar30->c1 = paVar30->a3;
        paVar30->a3 = fVar64;
        fVar64 = paVar30->c2;
        paVar30->c2 = paVar30->b3;
        paVar30->b3 = fVar64;
        fVar64 = paVar30->d1;
        paVar30->d1 = paVar30->a4;
        paVar30->a4 = fVar64;
        fVar64 = paVar30->d2;
        paVar30->d2 = paVar30->b4;
        paVar30->b4 = fVar64;
        fVar64 = paVar30->d3;
        paVar30->d3 = paVar30->c4;
        paVar30->c4 = fVar64;
        std::vector<TempMesh,_std::allocator<TempMesh>_>::vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_f08,
                   (long)iStack_fb0._M_current - (long)local_fb8 >> 3,(allocator_type *)local_cc0);
        if (local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar48 = 0;
          do {
            uVar61 = (ulong)local_d48.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar48];
            puVar38 = local_d78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      local_d60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar48];
            uVar57 = ((long)(local_f08._8_8_ - local_f08._0_8_) >> 5) * -0x5555555555555555;
            if (uVar57 < uVar61 || uVar57 - uVar61 == 0) {
              this_01 = DefaultLogger::get();
              Logger::error(this_01,"SIB: Face material index is invalid.");
              uVar61 = 0;
            }
            uVar29 = local_f08._0_8_;
            local_cb8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar51 = *puVar38;
            _local_cc0 = (pointer)CONCAT44((int)((ulong)_local_cc0 >> 0x20),uVar51);
            local_cb8._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((ulong)uVar51 << 2);
            pTVar47 = (pointer)(uVar29 + uVar61 * 0x60);
            if (uVar51 != 0) {
              puVar38 = puVar38 + 1;
              uVar57 = 0;
              do {
                *(int *)((long)&(local_cb8._M_pi)->_vptr__Sp_counted_base + uVar57 * 4) =
                     (int)((ulong)((long)(pTVar47->vtx).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar47->vtx).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555;
                uVar6 = local_dc0.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar38].x;
                uVar10 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar38].y;
                fVar64 = local_dc0.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar38].z;
                uVar7 = local_da8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar38[1]].x;
                uVar11 = local_da8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar38[1]].y;
                fVar65 = local_da8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar38[1]].z;
                local_ed8.x = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar38[2]].x;
                local_ed8.y = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar38[2]].y;
                local_ed8.z = local_d90.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar38[2]].z;
                local_1018._0_8_ =
                     CONCAT44(uStack_eb0._4_4_ +
                              fVar64 * (float)uStack_eb0 +
                              (float)uVar6 * (float)local_eb8 + local_eb8._4_4_ * (float)uVar10,
                              fStack_ebc +
                              fVar64 * (float)local_ec8._8_4_ +
                              (float)uVar6 * (float)local_ec8._0_4_ +
                              (float)local_ec8._4_4_ * (float)uVar10);
                local_1018.z = fVar64 * (float)uStack_ea0 +
                               (float)uVar6 * (float)local_ea8 + (float)uVar10 * local_ea8._4_4_ +
                               uStack_ea0._4_4_;
                local_ff8.x = fStack_e6c +
                              fVar65 * (float)local_e78._8_4_ +
                              (float)uVar7 * (float)local_e78._0_4_ +
                              (float)local_e78._4_4_ * (float)uVar11;
                local_ff8.y = uStack_e60._4_4_ +
                              fVar65 * (float)uStack_e60 +
                              (float)uVar7 * (float)local_e68 + local_e68._4_4_ * (float)uVar11;
                local_ff8.z = fVar65 * (float)uStack_e50 +
                              (float)uVar7 * (float)local_e58 + (float)uVar11 * local_e58._4_4_ +
                              uStack_e50._4_4_;
                iVar8._M_current =
                     (pTVar47->vtx).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar47->vtx).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pTVar47,
                             iVar8,&local_1018);
                }
                else {
                  (iVar8._M_current)->z = local_1018.z;
                  *(undefined8 *)iVar8._M_current = local_1018._0_8_;
                  ppaVar1 = &(pTVar47->vtx).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar8._M_current =
                     (pTVar47->nrm).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar47->nrm).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &pTVar47->nrm,iVar8,&local_ff8);
                }
                else {
                  (iVar8._M_current)->z = local_ff8.z;
                  (iVar8._M_current)->x = local_ff8.x;
                  (iVar8._M_current)->y = local_ff8.y;
                  ppaVar1 = &(pTVar47->nrm).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                iVar8._M_current =
                     (pTVar47->uv).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pTVar47->uv).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &pTVar47->uv,iVar8,&local_ed8);
                }
                else {
                  (iVar8._M_current)->z = local_ed8.z;
                  (iVar8._M_current)->x = local_ed8.x;
                  (iVar8._M_current)->y = local_ed8.y;
                  ppaVar1 = &(pTVar47->uv).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                uVar57 = uVar57 + 1;
                puVar38 = puVar38 + 3;
              } while (uVar57 < ((ulong)_local_cc0 & 0xffffffff));
            }
            std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                      (&pTVar47->faces,(value_type *)local_cc0);
            if (local_cb8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              operator_delete__(local_cb8._M_pi);
            }
            uVar48 = (ulong)((int)uVar48 + 1);
          } while (uVar48 < (ulong)((long)local_d60.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d60.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
          local_f38 = local_838._0_8_ & 0xffffffff;
        }
        local_cc0[4] = 0;
        memset(local_cc0 + 5,0x1b,0x3ff);
        local_cc0._0_4_ = (int)local_f38;
        pcVar60 = (char *)(local_f38 & 0xffffffff);
        memcpy(local_cc0 + 4,local_838 + 4,(size_t)pcVar60);
        pcVar60[(long)(local_cc0 + 4)] = '\0';
        local_e80->d1 = fStack_dd8;
        local_e80->d2 = fStack_dd4;
        local_e80->d3 = fStack_dd0;
        local_e80->d4 = local_dcc;
        local_e80->c1 = (float)uStack_de8;
        local_e80->c2 = uStack_de8._4_4_;
        local_e80->c3 = local_de0;
        local_e80->c4 = local_ddc;
        local_e80->b1 = (float)local_e08._16_4_;
        local_e80->b2 = (float)local_e08._20_4_;
        local_e80->b3 = (float)uStack_df0;
        local_e80->b4 = uStack_df0._4_4_;
        local_e80->a1 = (float)local_e08._0_4_;
        local_e80->a2 = (float)local_e08._4_4_;
        local_e80->a3 = (float)local_e08._8_4_;
        local_e80->a4 = (float)local_e08._12_4_;
        uVar48 = (long)local_f98._M_current - (long)pvStack_fa0 >> 3;
        local_fc8 = pcVar60;
        local_f28 = (void *)uVar48;
        local_878 = uVar48;
        if (local_f08._8_8_ != local_f08._0_8_) {
          uVar48 = 0;
          p_Var34 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
          pTVar47 = (pointer)local_f08._0_8_;
          do {
            if (pTVar47[uVar48].faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start !=
                pTVar47[uVar48].faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_1008 = (aiMaterial **)uVar48;
              paVar26 = (aiMesh *)operator_new(0x520);
              pTVar47 = pTVar47 + uVar48;
              paVar26->mPrimitiveTypes = 0;
              paVar26->mNumVertices = 0;
              paVar26->mNumFaces = 0;
              __s = &paVar26->mVertices;
              memset(__s,0,0xcc);
              paVar26->mBones = (aiBone **)0x0;
              paVar26->mMaterialIndex = 0;
              (paVar26->mName).length = 0;
              (paVar26->mName).data[0] = '\0';
              memset((paVar26->mName).data + 1,0x1b,0x3ff);
              paVar26->mNumAnimMeshes = 0;
              paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
              paVar26->mMethod = 0;
              (paVar26->mAABB).mMin.x = 0.0;
              (paVar26->mAABB).mMin.y = 0.0;
              (paVar26->mAABB).mMin.z = 0.0;
              (paVar26->mAABB).mMax.x = 0.0;
              (paVar26->mAABB).mMax.y = 0.0;
              (paVar26->mAABB).mMax.z = 0.0;
              memset(paVar26->mColors,0,0xa0);
              pcVar60 = local_fc8;
              (paVar26->mName).length = (ai_uint32)local_f38;
              local_1018._0_8_ = paVar26;
              memcpy((paVar26->mName).data,local_838 + 4,(size_t)local_fc8);
              (paVar26->mName).data[(long)pcVar60] = '\0';
              uVar48 = (long)(pTVar47->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar47->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4;
              uVar51 = (uint)uVar48;
              paVar26->mNumFaces = uVar51;
              uVar48 = uVar48 & 0xffffffff;
              puVar31 = (ulong *)operator_new__(uVar48 * 0x10 + 8);
              *puVar31 = uVar48;
              paVar32 = (aiFace *)(puVar31 + 1);
              if (uVar48 != 0) {
                paVar46 = paVar32;
                do {
                  paVar46->mNumIndices = 0;
                  paVar46->mIndices = (uint *)0x0;
                  paVar46 = paVar46 + 1;
                } while (paVar46 != paVar32 + uVar48);
              }
              paVar26->mFaces = paVar32;
              uVar48 = ((long)(pTVar47->vtx).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar47->vtx).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              uVar21 = (uint)uVar48;
              paVar26->mNumVertices = uVar21;
              uVar48 = (uVar48 & 0xffffffff) * 0xc;
              paVar33 = (aiVector3D *)operator_new__(uVar48);
              local_fe8 = __s;
              if (uVar21 != 0) {
                memset(paVar33,0,((uVar48 - 0xc) / 0xc) * 0xc + 0xc);
              }
              *local_fe8 = paVar33;
              paVar33 = (aiVector3D *)operator_new__(uVar48);
              if (uVar21 != 0) {
                memset(paVar33,0,((uVar48 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar26->mNormals = paVar33;
              paVar33 = (aiVector3D *)operator_new__(uVar48);
              if (uVar21 == 0) {
                paVar26->mTextureCoords[0] = paVar33;
                paVar26->mNumUVComponents[0] = 2;
                paVar26->mMaterialIndex = (uint)local_1008;
              }
              else {
                memset(paVar33,0,((uVar48 - 0xc) / 0xc) * 0xc + 0xc);
                paVar26->mTextureCoords[0] = paVar33;
                paVar26->mNumUVComponents[0] = 2;
                paVar26->mMaterialIndex = (uint)local_1008;
                lVar63 = 0;
                uVar48 = 0;
                do {
                  paVar9 = (pTVar47->vtx).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar33 = paVar26->mVertices;
                  *(undefined4 *)((long)&paVar33->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar33->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  paVar9 = (pTVar47->nrm).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar33 = paVar26->mNormals;
                  *(undefined4 *)((long)&paVar33->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar33->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  paVar9 = (pTVar47->uv).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar33 = paVar26->mTextureCoords[0];
                  *(undefined4 *)((long)&paVar33->z + lVar63) =
                       *(undefined4 *)((long)&paVar9->z + lVar63);
                  *(undefined8 *)((long)&paVar33->x + lVar63) =
                       *(undefined8 *)((long)&paVar9->x + lVar63);
                  uVar48 = uVar48 + 1;
                  lVar63 = lVar63 + 0xc;
                } while (uVar48 < paVar26->mNumVertices);
                uVar51 = paVar26->mNumFaces;
              }
              if (uVar51 != 0) {
                lVar63 = 0;
                uVar48 = 0;
                do {
                  aiFace::operator=((aiFace *)((long)&paVar26->mFaces->mNumIndices + lVar63),
                                    (aiFace *)
                                    ((long)&((pTVar47->faces).
                                             super__Vector_base<aiFace,_std::allocator<aiFace>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->mNumIndices
                                    + lVar63));
                  uVar48 = uVar48 + 1;
                  lVar63 = lVar63 + 0x10;
                  paVar26 = (aiMesh *)local_1018._0_8_;
                } while (uVar48 < *(uint *)(local_1018._0_8_ + 8));
              }
              if (local_f98._M_current == ppaStack_f90) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&pvStack_fa0,local_f98,
                           (aiMesh **)&local_1018);
                p_Var34 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
                pTVar47 = (pointer)local_f08._0_8_;
                uVar48 = (ulong)local_1008;
              }
              else {
                *local_f98._M_current = paVar26;
                local_f98._M_current = local_f98._M_current + 1;
                p_Var34 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f08._8_8_;
                pTVar47 = (pointer)local_f08._0_8_;
                uVar48 = (ulong)local_1008;
              }
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 < (ulong)(((long)p_Var34 - (long)pTVar47 >> 5) * -0x5555555555555555));
          uVar48 = (long)local_f98._M_current - (long)pvStack_fa0 >> 3;
        }
        local_870 = uVar48 - (long)local_f28;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&vStack_f70,(value_type *)local_cc0);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::~vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_f08);
        SIBMesh::~SIBMesh((SIBMesh *)local_e08);
      }
      else if (uVar56 != 0x54455850) goto LAB_0057ff51;
      StreamReader<false,_false>::SetPtr
                (&local_1050,
                 (int8_t *)
                 ((ulong)(uint)((int)local_1050.limit - (int)local_1050.buffer) +
                 CONCAT44(local_1050.buffer._4_4_,(int)local_1050.buffer)));
      StreamReader<false,_false>::SetReadLimit(&local_1050,local_f08._28_4_);
    } while (((int)local_1050.limit - (int)local_1050.current & 0xfffffff8U) != 0);
  }
  lVar63 = (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<SIBObject,std::allocator<SIBObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>>
            ((vector<SIBObject,std::allocator<SIBObject>> *)&vStack_f70,
             vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_f28 = local_fb8;
  uVar48 = (long)iStack_fb0._M_current - (long)local_fb8;
  uVar51 = (uint)(uVar48 >> 3);
  local_fd0->mNumMaterials = uVar51;
  local_fc8 = (char *)pvStack_fa0;
  uVar57 = (long)local_f98._M_current - (long)pvStack_fa0;
  uVar21 = (uint)(uVar57 >> 3);
  local_fd0->mNumMeshes = uVar21;
  local_fe8 = (aiVector3D **)local_f88;
  uVar61 = (long)iStack_f80._M_current - (long)local_f88;
  piVar62 = (int8_t *)(uVar61 >> 3);
  local_fd0->mNumLights = (uint)piVar62;
  if (uVar51 == 0) {
    local_1008 = (aiMaterial **)0x0;
  }
  else {
    local_1008 = (aiMaterial **)operator_new__(uVar48 & 0x7fffffff8);
  }
  local_fd0->mMaterials = local_1008;
  if (uVar21 == 0) {
    __dest = (aiMesh **)0x0;
  }
  else {
    __dest = (aiMesh **)operator_new__(uVar57 & 0x7fffffff8);
  }
  local_fd0->mMeshes = __dest;
  if ((uint)piVar62 == 0) {
    ppaVar35 = (aiLight **)0x0;
  }
  else {
    local_ee8 = piVar62;
    ppaVar35 = (aiLight **)operator_new__(uVar61 & 0x7fffffff8);
    piVar62 = local_ee8;
  }
  local_fd0->mLights = ppaVar35;
  if (uVar51 != 0) {
    memcpy(local_1008,local_f28,uVar48 & 0x7fffffff8);
  }
  if (uVar21 != 0) {
    memcpy(__dest,local_fc8,uVar57 & 0x7fffffff8);
  }
  if ((int)piVar62 != 0) {
    memcpy(ppaVar35,local_fe8,uVar61 & 0x7fffffff8);
  }
  this_02 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_02);
  pSVar16 = vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pSVar50 = vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar58._M_current = iStack_f80._M_current;
  ppaVar35 = local_f88;
  (this_02->mName).length = 9;
  builtin_strncpy((this_02->mName).data,"<SIBRoot>",10);
  lVar54 = ((long)iStack_f80._M_current - (long)local_f88 >> 3) +
           ((long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
  uVar51 = (uint)lVar54;
  this_02->mNumChildren = uVar51;
  if (uVar51 == 0) {
    ppaVar36 = (aiNode **)0x0;
  }
  else {
    ppaVar36 = (aiNode **)operator_new__(lVar54 * 8 & 0x7fffffff8);
  }
  this_02->mChildren = ppaVar36;
  local_fd0->mRootNode = this_02;
  if (pSVar16 == pSVar50) {
    uVar48 = 0;
  }
  else {
    uVar48 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                      ,0x38e,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar37 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar37);
      paVar43 = (aiNode *)(pSVar50 + uVar48);
      this_02->mChildren[uVar48] = paVar37;
      if (paVar37 != paVar43) {
        uVar51 = (paVar43->mName).length;
        (paVar37->mName).length = uVar51;
        memcpy((paVar37->mName).data,(paVar43->mName).data,(ulong)uVar51);
        (paVar37->mName).data[uVar51] = '\0';
      }
      paVar37->mParent = this_02;
      fVar64 = (paVar43->mTransformation).a2;
      fVar65 = (paVar43->mTransformation).a3;
      fVar66 = (paVar43->mTransformation).a4;
      fVar2 = (paVar43->mTransformation).b1;
      fVar4 = (paVar43->mTransformation).b2;
      fVar67 = (paVar43->mTransformation).b3;
      fVar68 = (paVar43->mTransformation).b4;
      fVar69 = (paVar43->mTransformation).c1;
      fVar70 = (paVar43->mTransformation).c2;
      fVar71 = (paVar43->mTransformation).c3;
      fVar72 = (paVar43->mTransformation).c4;
      fVar12 = (paVar43->mTransformation).d1;
      fVar13 = (paVar43->mTransformation).d2;
      fVar14 = (paVar43->mTransformation).d3;
      fVar15 = (paVar43->mTransformation).d4;
      (paVar37->mTransformation).a1 = (paVar43->mTransformation).a1;
      (paVar37->mTransformation).a2 = fVar64;
      (paVar37->mTransformation).a3 = fVar65;
      (paVar37->mTransformation).a4 = fVar66;
      (paVar37->mTransformation).b1 = fVar2;
      (paVar37->mTransformation).b2 = fVar4;
      (paVar37->mTransformation).b3 = fVar67;
      (paVar37->mTransformation).b4 = fVar68;
      (paVar37->mTransformation).c1 = fVar69;
      (paVar37->mTransformation).c2 = fVar70;
      (paVar37->mTransformation).c3 = fVar71;
      (paVar37->mTransformation).c4 = fVar72;
      (paVar37->mTransformation).d1 = fVar12;
      (paVar37->mTransformation).d2 = fVar13;
      (paVar37->mTransformation).d3 = fVar14;
      (paVar37->mTransformation).d4 = fVar15;
      uVar57 = *(ulong *)&paVar43->mNumChildren;
      uVar51 = (uint)uVar57;
      paVar37->mNumMeshes = uVar51;
      if (uVar51 == 0) {
        paVar37->mMeshes = (uint *)0x0;
      }
      else {
        puVar38 = (uint *)operator_new__((uVar57 & 0xffffffff) << 2);
        paVar37->mMeshes = puVar38;
        uVar57 = 0;
        do {
          paVar37->mMeshes[uVar57] = *(int *)&paVar43->mParent + (int)uVar57;
          uVar57 = uVar57 + 1;
        } while (uVar57 < paVar37->mNumMeshes);
      }
      if ((ulong)((lVar63 >> 3) * 0x3aef6ca970586723) <= uVar48) {
        paVar39 = (aiMetadata *)operator_new(0x18);
        paVar39->mNumProperties = 1;
        paVar40 = (aiString *)operator_new__(0x404);
        paVar40->length = 0;
        paVar40->data[0] = '\0';
        memset(paVar40->data + 1,0x1b,0x3ff);
        paVar39->mKeys = paVar40;
        paVar41 = (aiMetadataEntry *)operator_new__(0x10);
        *(undefined8 *)paVar41 = 0;
        paVar41->mData = (void *)0x0;
        paVar39->mValues = paVar41;
        paVar37->mMetaData = paVar39;
        _local_cc0 = (pointer)local_cb0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"IsInstance","");
        _Var19._M_pi = local_cb8._M_pi;
        if ((paVar39->mNumProperties != 0) &&
           (local_cb8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (local_cb8._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400) {
            paVar40 = paVar39->mKeys;
            paVar40->length = (ai_uint32)local_cb8._M_pi;
            memcpy(paVar40->data,_local_cc0,(size_t)local_cb8._M_pi);
            paVar40->data[(long)_Var19._M_pi] = '\0';
          }
          paVar39->mValues->mType = AI_BOOL;
          puVar42 = (undefined1 *)operator_new(1);
          *puVar42 = 1;
          paVar39->mValues->mData = puVar42;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_cc0 != local_cb0) {
          operator_delete(_local_cc0,local_cb0[0]._M_allocated_capacity + 1);
        }
      }
      uVar48 = uVar48 + 1;
      pSVar50 = vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppaVar35 = local_f88;
      iVar58._M_current = iStack_f80._M_current;
    } while (uVar48 < (ulong)(((long)vStack_f70.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_f70.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x3aef6ca970586723));
  }
  if (iVar58._M_current != ppaVar35) {
    uVar57 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SIB/SIBImporter.cpp"
                      ,0x3a7,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar37 = (aiNode *)ppaVar35[uVar57];
      if (paVar37 != (aiNode *)0x0) {
        paVar43 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar43);
        this_02->mChildren[uVar48] = paVar43;
        if (paVar43 != paVar37) {
          uVar51 = (paVar37->mName).length;
          (paVar43->mName).length = uVar51;
          memcpy((paVar43->mName).data,(paVar37->mName).data,(ulong)uVar51);
          (paVar43->mName).data[uVar51] = '\0';
        }
        uVar48 = uVar48 + 1;
        paVar43->mParent = this_02;
        ppaVar35 = local_f88;
        iVar58._M_current = iStack_f80._M_current;
      }
      uVar57 = uVar57 + 1;
    } while (uVar57 < (ulong)((long)iVar58._M_current - (long)ppaVar35 >> 3));
  }
  if (local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f58.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_f70.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f88 != (aiLight **)0x0) {
    operator_delete(local_f88,(long)local_f78 - (long)local_f88);
  }
  if (pvStack_fa0 != (void *)0x0) {
    operator_delete(pvStack_fa0,(long)ppaStack_f90 - (long)pvStack_fa0);
  }
  if (local_fb8 != (void *)0x0) {
    operator_delete(local_fb8,(long)local_fa8 - (long)local_fb8);
  }
  StreamReader<false,_false>::~StreamReader(&local_1050);
  return;
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}